

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
* fmt::v5::internal::vformat<fmt::v5::char8_t>
            (basic_string_view<fmt::v5::char8_t> format_str,
            basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
            args)

{
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
  args_00;
  iterator this;
  unsigned_long_long in_RDX;
  basic_memory_buffer<fmt::v5::char8_t,_500UL,_std::allocator<fmt::v5::char8_t>_> *in_RSI;
  basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
  *in_RDI;
  basic_memory_buffer<fmt::v5::char8_t,_500UL,_std::allocator<fmt::v5::char8_t>_> buffer;
  allocator<fmt::v5::char8_t> *in_stack_fffffffffffffd58;
  basic_memory_buffer<fmt::v5::char8_t,_500UL,_std::allocator<fmt::v5::char8_t>_>
  *in_stack_fffffffffffffd60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_2
  in_stack_fffffffffffffda8;
  basic_string_view<fmt::v5::char8_t> in_stack_fffffffffffffdb0;
  
  std::allocator<fmt::v5::char8_t>::allocator((allocator<fmt::v5::char8_t> *)0x2da8fb);
  basic_memory_buffer<fmt::v5::char8_t,_500UL,_std::allocator<fmt::v5::char8_t>_>::
  basic_memory_buffer(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::allocator<fmt::v5::char8_t>::~allocator((allocator<fmt::v5::char8_t> *)0x2da916);
  args_00.field_1.args_ = in_stack_fffffffffffffda8.args_;
  args_00.types_ = in_RDX;
  this = vformat_to<fmt::v5::char8_t>
                   (&in_RSI->super_basic_buffer<fmt::v5::char8_t>,in_stack_fffffffffffffdb0,args_00)
  ;
  to_string<fmt::v5::char8_t,500ul>(in_RSI);
  basic_memory_buffer<fmt::v5::char8_t,_500UL,_std::allocator<fmt::v5::char8_t>_>::
  ~basic_memory_buffer
            ((basic_memory_buffer<fmt::v5::char8_t,_500UL,_std::allocator<fmt::v5::char8_t>_> *)
             this.container);
  return in_RDI;
}

Assistant:

inline std::basic_string<Char> internal::vformat(
    basic_string_view<Char> format_str,
    basic_format_args<typename buffer_context<Char>::type> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(buffer, format_str, args);
  return fmt::to_string(buffer);
}